

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

Opnd * __thiscall
GlobOpt::CopyProp(GlobOpt *this,Opnd *opnd,Instr *instr,Value *val,IndirOpnd *parentIndirOpnd)

{
  short sVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  IRType type;
  int32 iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  RegOpnd *pRVar10;
  Instr *pIVar11;
  undefined4 *puVar12;
  Instr *pIVar13;
  IndirOpnd *pIVar14;
  Instr *pIVar15;
  Var address;
  JITTimeFunctionBody *pJVar16;
  Int64ConstOpnd *this_00;
  int64 iVar17;
  SymOpnd *pSVar18;
  GlobOptBlockData *this_01;
  StackSym *pSVar19;
  StackSym *this_02;
  Opnd *pOVar20;
  Sym *pSVar21;
  StackSym *copySym;
  SymOpnd *symOpnd;
  RegOpnd *regOpnd;
  Sym *opndSym;
  Int64ConstOpnd *intOpnd_1;
  Opnd *dst;
  IntConstOpnd *intOpnd;
  IntConstType constVal;
  IRType opndType;
  AddrOpnd *addrOpnd;
  Opnd *constOpnd;
  IndirOpnd *indir;
  Opnd *src;
  Opnd *pOStack_78;
  int i;
  Opnd *srcs [3];
  int64 local_58;
  int64 int64ConstantValue;
  ValueInfo *pVStack_48;
  int32 intConstantValue;
  ValueInfo *valueInfo;
  StackSym *sym;
  IndirOpnd *parentIndirOpnd_local;
  Value *val_local;
  Instr *instr_local;
  Opnd *opnd_local;
  GlobOpt *this_local;
  
  sym = (StackSym *)parentIndirOpnd;
  parentIndirOpnd_local = (IndirOpnd *)val;
  val_local = (Value *)instr;
  instr_local = (Instr *)opnd;
  opnd_local = (Opnd *)this;
  if (parentIndirOpnd == (IndirOpnd *)0x0) {
    pOVar20 = IR::Instr::GetSrc1(instr);
    pIVar13 = instr_local;
    if (((opnd != pOVar20) &&
        (pIVar15 = (Instr *)IR::Instr::GetSrc2((Instr *)val_local), pIVar11 = instr_local,
        pIVar13 != pIVar15)) &&
       ((pIVar13 = (Instr *)IR::Instr::GetDst((Instr *)val_local), pIVar11 != pIVar13 ||
        (bVar3 = IR::Opnd::IsIndirOpnd((Opnd *)instr_local), !bVar3)))) goto LAB_0058f0ff;
  }
  else {
    pRVar10 = IR::IndirOpnd::GetBaseOpnd(parentIndirOpnd);
    pIVar13 = instr_local;
    if (((RegOpnd *)opnd != pRVar10) &&
       (pIVar11 = (Instr *)IR::IndirOpnd::GetIndexOpnd((IndirOpnd *)sym), pIVar13 != pIVar11)) {
LAB_0058f0ff:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0xe8d,
                         "(parentIndirOpnd ? opnd == parentIndirOpnd->GetBaseOpnd() || opnd == parentIndirOpnd->GetIndexOpnd() : opnd == instr->GetSrc1() || opnd == instr->GetSrc2() || opnd == instr->GetDst() && opnd->IsIndirOpnd())"
                         ,
                         "parentIndirOpnd ? opnd == parentIndirOpnd->GetBaseOpnd() || opnd == parentIndirOpnd->GetIndexOpnd() : opnd == instr->GetSrc1() || opnd == instr->GetSrc2() || opnd == instr->GetDst() && opnd->IsIndirOpnd()"
                        );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 0;
    }
  }
  bVar3 = IsLoopPrePass(this);
  pIVar13 = instr_local;
  if (bVar3) {
    return (Opnd *)instr_local;
  }
  if (((short)val_local[3].valueNumber == 0x270) || ((short)val_local[3].valueNumber == 0x273)) {
    return (Opnd *)instr_local;
  }
  if (((short)val_local[3].valueNumber == 0x277) &&
     (pIVar11 = (Instr *)IR::Instr::GetSrc2((Instr *)val_local), pIVar13 == pIVar11)) {
    return (Opnd *)instr_local;
  }
  bVar3 = Js::IsSimd128Opcode((OpCode)val_local[3].valueNumber);
  if ((bVar3) && (pOVar20 = IR::Instr::GetSrc1((Instr *)val_local), pOVar20 != (Opnd *)0x0)) {
    pOVar20 = IR::Instr::GetSrc1((Instr *)val_local);
    bVar3 = IR::Opnd::IsRegOpnd(pOVar20);
    if ((bVar3) && (pOVar20 = IR::Instr::GetSrc2((Instr *)val_local), pOVar20 == (Opnd *)0x0)) {
      pOVar20 = IR::Instr::GetSrc1((Instr *)val_local);
      valueInfo = (ValueInfo *)IR::Opnd::GetStackSym(pOVar20);
      if ((((StackSym *)valueInfo != (StackSym *)0x0) &&
          (bVar3 = StackSym::IsSingleDef((StackSym *)valueInfo), bVar3)) &&
         (pIVar13 = StackSym::GetInstrDef((StackSym *)valueInfo), pIVar13->m_opcode == ExtendArg_A))
      {
        return (Opnd *)instr_local;
      }
    }
  }
  pVStack_48 = ::Value::GetValueInfo((Value *)parentIndirOpnd_local);
  bVar3 = Func::HasFinally(this->func);
  if (((bVar3) && ((short)val_local[3].valueNumber == 0x1ed)) &&
     ((pSVar21 = ValueInfo::GetSymStore(pVStack_48), pSVar21 != (Sym *)0x0 &&
      (pSVar21 = ValueInfo::GetSymStore(pVStack_48), pSVar21->m_id == 0)))) {
    return (Opnd *)instr_local;
  }
  bVar3 = ValueInfo::TryGetIntConstantValue
                    (pVStack_48,(int32 *)((long)&int64ConstantValue + 4),false);
  if (!bVar3) {
    bVar3 = ValueInfo::TryGetIntConstantValue(pVStack_48,&local_58,false);
    if (bVar3) {
      uVar6 = Func::GetSourceContextId(this->func);
      uVar7 = Func::GetLocalFunctionId(this->func);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,ConstPropPhase,uVar6,uVar7);
      if (!bVar3) {
        uVar6 = Func::GetSourceContextId(this->func);
        uVar7 = Func::GetLocalFunctionId(this->func);
        bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01eb5b30,Int64ConstPropPhase,uVar6,uVar7);
        if (bVar3) {
          pJVar16 = Func::GetJITFunctionBody(this->func);
          bVar3 = JITTimeFunctionBody::IsWasmFunction(pJVar16);
          if (!bVar3) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar12 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0xf69,"(this->func->GetJITFunctionBody()->IsWasmFunction())",
                               "this->func->GetJITFunctionBody()->IsWasmFunction()");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar12 = 0;
          }
          pJVar16 = Func::GetJITFunctionBody(this->func);
          bVar3 = JITTimeFunctionBody::IsWasmFunction(pJVar16);
          if ((bVar3) && (bVar3 = IR::Opnd::IsInt64((Opnd *)instr_local), iVar17 = local_58, bVar3))
          {
            type = IR::Opnd::GetType((Opnd *)instr_local);
            this_00 = IR::Int64ConstOpnd::New(iVar17,type,*(Func **)(val_local + 2));
            uVar6 = Func::GetSourceContextId(this->func);
            uVar7 = Func::GetLocalFunctionId(this->func);
            bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,GlobOptPhase,uVar6,uVar7);
            if (bVar3) {
              Output::Print(L"TRACE ");
              bVar3 = IsLoopPrePass(this);
              if (bVar3) {
                Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                              (ulong)(this->prePassLoop->loopNumber - 1));
              }
              Output::Print(L": ");
              IR::Opnd::Dump((Opnd *)instr_local);
              Output::Print(L" : ");
              iVar17 = IR::Opnd::GetImmediateValue(&this_00->super_Opnd,*(Func **)(val_local + 2));
              Output::Print(L"Constant prop %lld (value:%lld)\n",iVar17,local_58);
              Output::Flush();
            }
            CaptureByteCodeSymUses(this,(Instr *)val_local);
            instr_local = (Instr *)IR::Instr::ReplaceSrc
                                             ((Instr *)val_local,(Opnd *)instr_local,
                                              &this_00->super_Opnd);
          }
          return (Opnd *)instr_local;
        }
      }
      return (Opnd *)instr_local;
    }
    regOpnd = (RegOpnd *)0x0;
    bVar3 = IR::Opnd::IsRegOpnd((Opnd *)instr_local);
    if (bVar3) {
      pRVar10 = IR::Opnd::AsRegOpnd((Opnd *)instr_local);
      regOpnd = (RegOpnd *)pRVar10->m_sym;
    }
    else {
      bVar3 = IR::Opnd::IsSymOpnd((Opnd *)instr_local);
      if (bVar3) {
        pSVar18 = IR::Opnd::AsSymOpnd((Opnd *)instr_local);
        regOpnd = (RegOpnd *)pSVar18->m_sym;
      }
    }
    if (regOpnd == (RegOpnd *)0x0) {
      return (Opnd *)instr_local;
    }
    uVar6 = Func::GetSourceContextId(this->func);
    uVar7 = Func::GetLocalFunctionId(this->func);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,CopyPropPhase,uVar6,uVar7);
    if (bVar3) {
      SetSymStoreDirect(this,pVStack_48,(Sym *)regOpnd);
      return (Opnd *)instr_local;
    }
    this_01 = CurrentBlockData(this);
    pSVar19 = GlobOptBlockData::GetCopyPropSym
                        (this_01,(Sym *)regOpnd,(Value *)parentIndirOpnd_local);
    if (pSVar19 == (StackSym *)0x0) {
      pSVar21 = ValueInfo::GetSymStore(pVStack_48);
      if ((pSVar21 != (Sym *)0x0) && ((short)val_local[3].valueNumber == 0x45)) {
        pOVar20 = IR::Instr::GetDst((Instr *)val_local);
        bVar3 = IR::Opnd::IsRegOpnd(pOVar20);
        if (bVar3) {
          pSVar19 = (StackSym *)ValueInfo::GetSymStore(pVStack_48);
          pOVar20 = IR::Instr::GetDst((Instr *)val_local);
          pRVar10 = IR::Opnd::AsRegOpnd(pOVar20);
          if (pSVar19 == pRVar10->m_sym) {
            return (Opnd *)instr_local;
          }
        }
      }
      SetSymStoreDirect(this,pVStack_48,(Sym *)regOpnd);
      return (Opnd *)instr_local;
    }
    bVar3 = Sym::IsStackSym((Sym *)regOpnd);
    if (bVar3) {
      iVar8 = StackSym::GetSymSize(pSVar19);
      this_02 = Sym::AsStackSym((Sym *)regOpnd);
      iVar9 = StackSym::GetSymSize(this_02);
      if (iVar8 != iVar9) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0xf8d,
                           "(!opndSym->IsStackSym() || copySym->GetSymSize() == opndSym->AsStackSym()->GetSymSize())"
                           ,
                           "!opndSym->IsStackSym() || copySym->GetSymSize() == opndSym->AsStackSym()->GetSymSize()"
                          );
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
    }
    pOVar20 = CopyPropReplaceOpnd(this,(Instr *)val_local,(Opnd *)instr_local,pSVar19,
                                  (IndirOpnd *)sym);
    return pOVar20;
  }
  uVar6 = Func::GetSourceContextId(this->func);
  uVar7 = Func::GetLocalFunctionId(this->func);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,ConstPropPhase,uVar6,uVar7);
  if (bVar3) {
    return (Opnd *)instr_local;
  }
  if (((((short)val_local[3].valueNumber == 0x9a) || ((short)val_local[3].valueNumber == 0x9c)) ||
      ((short)val_local[3].valueNumber == 0x22c)) &&
     (pIVar13 = (Instr *)IR::Instr::GetSrc1((Instr *)val_local), pIVar13 == instr_local)) {
    pOVar20 = IR::Instr::GetDst((Instr *)val_local);
    pIVar14 = IR::Opnd::AsIndirOpnd(pOVar20);
    pRVar10 = IR::IndirOpnd::GetBaseOpnd(pIVar14);
    srcs[2]._6_2_ =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         IR::Opnd::GetValueType(&pRVar10->super_Opnd);
    bVar3 = ValueType::IsLikelyNativeArray((ValueType *)((long)srcs + 0x16));
    if (bVar3) {
      return (Opnd *)instr_local;
    }
  }
  pIVar13 = instr_local;
  pIVar15 = (Instr *)IR::Instr::GetSrc1((Instr *)val_local);
  pIVar11 = instr_local;
  if ((pIVar13 != pIVar15) &&
     (pIVar13 = (Instr *)IR::Instr::GetSrc2((Instr *)val_local), pIVar11 != pIVar13)) {
    uVar6 = Func::GetSourceContextId(*(Func **)(val_local + 2));
    uVar7 = Func::GetLocalFunctionId(*(Func **)(val_local + 2));
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,IndirCopyPropPhase,uVar6,uVar7);
    if (bVar3) {
      return (Opnd *)instr_local;
    }
    pOStack_78 = IR::Instr::GetSrc1((Instr *)val_local);
    srcs[0] = IR::Instr::GetSrc2((Instr *)val_local);
    srcs[1] = IR::Instr::GetDst((Instr *)val_local);
    src._4_4_ = 0;
    do {
      if (2 < src._4_4_) {
        return (Opnd *)instr_local;
      }
      pOVar20 = *(Opnd **)((long)&stack0xffffffffffffff88 + (long)(int)src._4_4_ * 8);
      if ((pOVar20 != (Opnd *)0x0) && (bVar3 = IR::Opnd::IsIndirOpnd(pOVar20), bVar3)) {
        pIVar14 = IR::Opnd::AsIndirOpnd(pOVar20);
        iVar5 = IR::IndirOpnd::GetOffset(pIVar14);
        pIVar13 = instr_local;
        if (((long)iVar5 + (long)(int)int64ConstantValue._4_4_ < 0x80000000) &&
           (pIVar11 = (Instr *)IR::IndirOpnd::GetIndexOpnd(pIVar14), pIVar13 == pIVar11)) {
          bVar4 = IR::IndirOpnd::GetScale(pIVar14);
          if (bVar4 != '\0') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar12 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0xeed,"(indir->GetScale() == 0)","indir->GetScale() == 0");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar12 = 0;
          }
          uVar6 = Func::GetSourceContextId(this->func);
          uVar7 = Func::GetLocalFunctionId(this->func);
          bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,GlobOptPhase,uVar6,uVar7);
          if (bVar3) {
            Output::Print(L"TRACE ");
            bVar3 = IsLoopPrePass(this);
            if (bVar3) {
              Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                            (ulong)(this->prePassLoop->loopNumber - 1));
            }
            Output::Print(L": ");
            IR::Opnd::Dump((Opnd *)instr_local);
            Output::Print(L" : ");
            Output::Print(L"Constant prop indir index into offset (value: %d)\n",
                          (ulong)int64ConstantValue._4_4_);
            Output::Flush();
          }
          CaptureByteCodeSymUses(this,(Instr *)val_local);
          iVar5 = IR::IndirOpnd::GetOffset(pIVar14);
          IR::IndirOpnd::SetOffset(pIVar14,iVar5 + int64ConstantValue._4_4_,false);
          IR::IndirOpnd::SetIndexOpnd(pIVar14,(RegOpnd *)0x0);
        }
      }
      src._4_4_ = src._4_4_ + 1;
    } while( true );
  }
  bVar3 = Js::TaggedInt::IsOverflow(int64ConstantValue._4_4_);
  if (bVar3) {
    return (Opnd *)instr_local;
  }
  bVar3 = IR::Opnd::IsVar((Opnd *)instr_local);
  if (bVar3) {
    address = Js::TaggedInt::ToVarUnchecked(int64ConstantValue._4_4_);
    addrOpnd = IR::AddrOpnd::New(address,AddrOpndKindConstantVar,*(Func **)(val_local + 2),false,
                                 (Var)0x0);
    uVar6 = Func::GetSourceContextId(this->func);
    uVar7 = Func::GetLocalFunctionId(this->func);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,GlobOptPhase,uVar6,uVar7);
    if (bVar3) {
      Output::Print(L"TRACE ");
      bVar3 = IsLoopPrePass(this);
      if (bVar3) {
        Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                      (ulong)(this->prePassLoop->loopNumber - 1));
      }
      Output::Print(L": ");
      IR::Opnd::Dump((Opnd *)instr_local);
      Output::Print(L" : ");
      Output::Print(L"Constant prop %d (value:%d)\n",addrOpnd->m_address,
                    (ulong)int64ConstantValue._4_4_);
      Output::Flush();
    }
  }
  else {
    bVar3 = IR::Opnd::IsInt32((Opnd *)instr_local);
    if (((!bVar3) && (bVar3 = IR::Opnd::IsInt64((Opnd *)instr_local), !bVar3)) &&
       (bVar3 = IR::Opnd::IsUInt32((Opnd *)instr_local), !bVar3)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0xf09,"(opnd->IsInt32() || opnd->IsInt64() || opnd->IsUInt32())",
                         "opnd->IsInt32() || opnd->IsInt64() || opnd->IsUInt32()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 0;
    }
    bVar3 = IR::Opnd::IsUInt32((Opnd *)instr_local);
    if (bVar3) {
      intOpnd = (IntConstOpnd *)(ulong)int64ConstantValue._4_4_;
      constVal._7_1_ = TyUint32;
    }
    else {
      intOpnd = (IntConstOpnd *)(long)(int)int64ConstantValue._4_4_;
      constVal._7_1_ = TyInt32;
    }
    addrOpnd = (AddrOpnd *)
               IR::IntConstOpnd::New
                         ((IntConstType)intOpnd,constVal._7_1_,*(Func **)(val_local + 2),false);
    uVar6 = Func::GetSourceContextId(this->func);
    uVar7 = Func::GetLocalFunctionId(this->func);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,GlobOptPhase,uVar6,uVar7);
    if (bVar3) {
      Output::Print(L"TRACE ");
      bVar3 = IsLoopPrePass(this);
      if (bVar3) {
        Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                      (ulong)(this->prePassLoop->loopNumber - 1));
      }
      Output::Print(L": ");
      IR::Opnd::Dump((Opnd *)instr_local);
      Output::Print(L" : ");
      iVar17 = IR::Opnd::GetImmediateValue((Opnd *)addrOpnd,*(Func **)(val_local + 2));
      Output::Print(L"Constant prop %d (value:%d)\n",iVar17,(ulong)int64ConstantValue._4_4_);
      Output::Flush();
    }
  }
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,FieldCopyPropPhase);
  if (bVar3) {
    IR::Instr::DumpFieldCopyPropTestTrace
              ((Instr *)val_local,(bool)((byte)(*(uint *)&this->field_0xf4 >> 5) & 1));
  }
  CaptureByteCodeSymUses(this,(Instr *)val_local);
  instr_local = (Instr *)IR::Instr::ReplaceSrc
                                   ((Instr *)val_local,(Opnd *)instr_local,&addrOpnd->super_Opnd);
  sVar1 = (short)val_local[3].valueNumber;
  if (sVar1 == 0x2b) {
    *(undefined2 *)&val_local[3].valueNumber = 0x2a;
    return (Opnd *)instr_local;
  }
  if (sVar1 != 0x45) {
    if (sVar1 == 0x59) {
LAB_0058fc8f:
      pOVar20 = IR::Instr::GetDst((Instr *)val_local);
      bVar3 = IR::Opnd::IsRegOpnd(pOVar20);
      if (!bVar3) {
        pOVar20 = IR::Instr::GetDst((Instr *)val_local);
        pSVar18 = IR::Opnd::AsSymOpnd(pOVar20);
        pSVar19 = Sym::AsStackSym(pSVar18->m_sym);
        StackSym::SetIsIntConst(pSVar19,(long)(int)int64ConstantValue._4_4_);
        return (Opnd *)instr_local;
      }
      pOVar20 = IR::Instr::GetDst((Instr *)val_local);
      pRVar10 = IR::Opnd::AsRegOpnd(pOVar20);
      if ((*(uint *)&pRVar10->m_sym->field_0x18 & 1) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0xf48,"(instr->GetDst()->AsRegOpnd()->m_sym->m_isSingleDef)",
                           "instr->GetDst()->AsRegOpnd()->m_sym->m_isSingleDef");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
      pOVar20 = IR::Instr::GetDst((Instr *)val_local);
      pRVar10 = IR::Opnd::AsRegOpnd(pOVar20);
      pSVar19 = Sym::AsStackSym(&pRVar10->m_sym->super_Sym);
      StackSym::SetIsIntConst(pSVar19,(long)(int)int64ConstantValue._4_4_);
      return (Opnd *)instr_local;
    }
    if (((((sVar1 != 0x5e) && (sVar1 != 0x66)) &&
         ((sVar1 != 0x68 && ((sVar1 != 0x6a && (sVar1 != 0x6c)))))) && (sVar1 != 0x6e)) &&
       ((((1 < (ushort)(sVar1 - 0x84U) && (sVar1 != 0x8c)) && (sVar1 != 0x123)) && (sVar1 != 0x131))
       )) {
      if (((ushort)(sVar1 - 0x1edU) < 2) || (sVar1 == 0x1f2)) goto LAB_0058fc8f;
      if (1 < (ushort)(sVar1 - 0x1f5U)) {
        if (sVar1 != 0x1f8) {
          return (Opnd *)instr_local;
        }
        pIVar13 = (Instr *)IR::Instr::GetSrc2((Instr *)val_local);
        if (pIVar13 != instr_local) {
          return (Opnd *)instr_local;
        }
        *(undefined2 *)&val_local[3].valueNumber = 0x1f7;
        IR::Instr::FreeSrc2((Instr *)val_local);
        return (Opnd *)0x0;
      }
    }
    *(undefined2 *)&val_local[3].valueNumber = 0x45;
  }
  pOVar20 = IR::Instr::GetDst((Instr *)val_local);
  bVar3 = IR::Opnd::IsRegOpnd(pOVar20);
  if (bVar3) {
    pRVar10 = IR::Opnd::AsRegOpnd(pOVar20);
    bVar3 = StackSym::IsSingleDef(pRVar10->m_sym);
    if (bVar3) {
      pRVar10 = IR::Opnd::AsRegOpnd(pOVar20);
      StackSym::SetIsIntConst(pRVar10->m_sym,(long)(int)int64ConstantValue._4_4_);
    }
  }
  return (Opnd *)instr_local;
}

Assistant:

IR::Opnd *
GlobOpt::CopyProp(IR::Opnd *opnd, IR::Instr *instr, Value *val, IR::IndirOpnd *parentIndirOpnd)
{
    Assert(
        parentIndirOpnd
            ? opnd == parentIndirOpnd->GetBaseOpnd() || opnd == parentIndirOpnd->GetIndexOpnd()
            : opnd == instr->GetSrc1() || opnd == instr->GetSrc2() || opnd == instr->GetDst() && opnd->IsIndirOpnd());

    if (this->IsLoopPrePass())
    {
        // Transformations are not legal in prepass...
        return opnd;
    }

    if (instr->m_opcode == Js::OpCode::CheckFixedFld || instr->m_opcode == Js::OpCode::CheckPropertyGuardAndLoadType)
    {
        // Don't copy prop into CheckFixedFld or CheckPropertyGuardAndLoadType
        return opnd;
    }

    // Don't copy-prop link operands of ExtendedArgs
    if (instr->m_opcode == Js::OpCode::ExtendArg_A && opnd == instr->GetSrc2())
    {
        return opnd;
    }

    // Don't copy-prop operand of SIMD instr with ExtendedArg operands. Each instr should have its exclusive EA sequence.
    if (
            Js::IsSimd128Opcode(instr->m_opcode) &&
            instr->GetSrc1() != nullptr &&
            instr->GetSrc1()->IsRegOpnd() &&
            instr->GetSrc2() == nullptr
       )
    {
        StackSym *sym = instr->GetSrc1()->GetStackSym();
        if (sym && sym->IsSingleDef() && sym->GetInstrDef()->m_opcode == Js::OpCode::ExtendArg_A)
        {
                return opnd;
        }
    }

    ValueInfo *valueInfo = val->GetValueInfo();

    if (this->func->HasFinally())
    {
        // s0 = undefined was added on functions with early exit in try-finally functions, that can get copy-proped and case incorrect results
        if (instr->m_opcode == Js::OpCode::ArgOut_A_Inline && valueInfo->GetSymStore() &&
            valueInfo->GetSymStore()->m_id == 0)
        {
            // We don't want to copy-prop s0 (return symbol) into inlinee code
            return opnd;
        }
    }

    // Constant prop?
    int32 intConstantValue;
    int64 int64ConstantValue;
    if (valueInfo->TryGetIntConstantValue(&intConstantValue))
    {
        if (PHASE_OFF(Js::ConstPropPhase, this->func))
        {
            return opnd;
        }

        if ((
                instr->m_opcode == Js::OpCode::StElemI_A ||
                instr->m_opcode == Js::OpCode::StElemI_A_Strict ||
                instr->m_opcode == Js::OpCode::StElemC
            ) && instr->GetSrc1() == opnd)
        {
            // Disabling prop to src of native array store, because we were losing the chance to type specialize.
            // Is it possible to type specialize this src if we allow constants, etc., to be prop'd here?
            if (instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->GetValueType().IsLikelyNativeArray())
            {
                return opnd;
            }
        }

        if(opnd != instr->GetSrc1() && opnd != instr->GetSrc2())
        {
            if(PHASE_OFF(Js::IndirCopyPropPhase, instr->m_func))
            {
                return opnd;
            }

            // Const-prop an indir opnd's constant index into its offset
            IR::Opnd *srcs[] = { instr->GetSrc1(), instr->GetSrc2(), instr->GetDst() };
            for(int i = 0; i < sizeof(srcs) / sizeof(srcs[0]); ++i)
            {
                const auto src = srcs[i];
                if(!src || !src->IsIndirOpnd())
                {
                    continue;
                }

                const auto indir = src->AsIndirOpnd();
                if ((int64)indir->GetOffset() + intConstantValue > INT32_MAX)
                {
                    continue;
                }
                if(opnd == indir->GetIndexOpnd())
                {
                    Assert(indir->GetScale() == 0);
                    GOPT_TRACE_OPND(opnd, _u("Constant prop indir index into offset (value: %d)\n"), intConstantValue);
                    this->CaptureByteCodeSymUses(instr);
                    indir->SetOffset(indir->GetOffset() + intConstantValue);
                    indir->SetIndexOpnd(nullptr);
                }
            }

            return opnd;
        }

        if (Js::TaggedInt::IsOverflow(intConstantValue))
        {
            return opnd;
        }

        IR::Opnd *constOpnd;

        if (opnd->IsVar())
        {
            IR::AddrOpnd *addrOpnd = IR::AddrOpnd::New(Js::TaggedInt::ToVarUnchecked((int)intConstantValue), IR::AddrOpndKindConstantVar, instr->m_func);

            GOPT_TRACE_OPND(opnd, _u("Constant prop %d (value:%d)\n"), addrOpnd->m_address, intConstantValue);
            constOpnd = addrOpnd;
        }
        else
        {
            // Note: Jit loop body generates some i32 operands...
            Assert(opnd->IsInt32() || opnd->IsInt64() || opnd->IsUInt32());
            IRType opndType;
            IntConstType constVal;
            if (opnd->IsUInt32())
            {
                // avoid sign extension
                constVal = (uint32)intConstantValue;
                opndType = TyUint32;
            }
            else
            {
                constVal = intConstantValue;
                opndType = TyInt32;
            }
            IR::IntConstOpnd *intOpnd = IR::IntConstOpnd::New(constVal, opndType, instr->m_func);

            GOPT_TRACE_OPND(opnd, _u("Constant prop %d (value:%d)\n"), intOpnd->GetImmediateValue(instr->m_func), intConstantValue);
            constOpnd = intOpnd;
        }

#if ENABLE_DEBUG_CONFIG_OPTIONS
        //Need to update DumpFieldCopyPropTestTrace for every new opcode that is added for fieldcopyprop
        if(Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::FieldCopyPropPhase))
        {
            instr->DumpFieldCopyPropTestTrace(this->isRecursiveCallOnLandingPad);
        }
#endif

        this->CaptureByteCodeSymUses(instr);
        opnd = instr->ReplaceSrc(opnd, constOpnd);

        switch (instr->m_opcode)
        {
        case Js::OpCode::LdSlot:
        case Js::OpCode::LdSlotArr:
        case Js::OpCode::LdFld:
        case Js::OpCode::LdFldForTypeOf:
        case Js::OpCode::LdRootFldForTypeOf:
        case Js::OpCode::LdFldForCallApplyTarget:
        case Js::OpCode::LdRootFld:
        case Js::OpCode::LdMethodFld:
        case Js::OpCode::LdRootMethodFld:
        case Js::OpCode::LdMethodFromFlags:
        case Js::OpCode::ScopedLdMethodFld:
        case Js::OpCode::ScopedLdFld:
        case Js::OpCode::ScopedLdFldForTypeOf:
            instr->m_opcode = Js::OpCode::Ld_A;
        case Js::OpCode::Ld_A:
            {
                IR::Opnd * dst = instr->GetDst();
                if (dst->IsRegOpnd() && dst->AsRegOpnd()->m_sym->IsSingleDef())
                {
                    dst->AsRegOpnd()->m_sym->SetIsIntConst((int)intConstantValue);
                }
                break;
            }
        case Js::OpCode::ArgOut_A:
        case Js::OpCode::ArgOut_A_Inline:
        case Js::OpCode::ArgOut_A_FixupForStackArgs:
        case Js::OpCode::ArgOut_A_InlineBuiltIn:

            if (instr->GetDst()->IsRegOpnd())
            {
                Assert(instr->GetDst()->AsRegOpnd()->m_sym->m_isSingleDef);
                instr->GetDst()->AsRegOpnd()->m_sym->AsStackSym()->SetIsIntConst((int)intConstantValue);
            }
            else
            {
                instr->GetDst()->AsSymOpnd()->m_sym->AsStackSym()->SetIsIntConst((int)intConstantValue);
            }
            break;

        case Js::OpCode::TypeofElem:
            instr->m_opcode = Js::OpCode::Typeof;
            break;

        case Js::OpCode::StSlotChkUndecl:
            if (instr->GetSrc2() == opnd)
            {
                // Src2 here should refer to the same location as the Dst operand, which we need to keep live
                // due to the implicit read for ChkUndecl.
                instr->m_opcode = Js::OpCode::StSlot;
                instr->FreeSrc2();
                opnd = nullptr;
            }
            break;
        }
        return opnd;
    }
    else if (valueInfo->TryGetIntConstantValue(&int64ConstantValue, false))
    {
        if (PHASE_OFF(Js::ConstPropPhase, this->func) || !PHASE_ON(Js::Int64ConstPropPhase, this->func))
        {
            return opnd;
        }

        Assert(this->func->GetJITFunctionBody()->IsWasmFunction());
        if (this->func->GetJITFunctionBody()->IsWasmFunction() && opnd->IsInt64())
        {
            IR::Int64ConstOpnd *intOpnd = IR::Int64ConstOpnd::New(int64ConstantValue, opnd->GetType(), instr->m_func);
            GOPT_TRACE_OPND(opnd, _u("Constant prop %lld (value:%lld)\n"), intOpnd->GetImmediateValue(instr->m_func), int64ConstantValue);
            this->CaptureByteCodeSymUses(instr);
            opnd = instr->ReplaceSrc(opnd, intOpnd);
        }
        return opnd;
    }

    Sym *opndSym = nullptr;
    if (opnd->IsRegOpnd())
    {
        IR::RegOpnd *regOpnd = opnd->AsRegOpnd();
        opndSym = regOpnd->m_sym;
    }
    else if (opnd->IsSymOpnd())
    {
        IR::SymOpnd *symOpnd = opnd->AsSymOpnd();
        opndSym = symOpnd->m_sym;
    }
    if (!opndSym)
    {
        return opnd;
    }

    if (PHASE_OFF(Js::CopyPropPhase, this->func))
    {
        this->SetSymStoreDirect(valueInfo, opndSym);
        return opnd;
    }

    StackSym *copySym = CurrentBlockData()->GetCopyPropSym(opndSym, val);
    if (copySym != nullptr)
    {
        Assert(!opndSym->IsStackSym() || copySym->GetSymSize() == opndSym->AsStackSym()->GetSymSize());
        // Copy prop.
        return CopyPropReplaceOpnd(instr, opnd, copySym, parentIndirOpnd);
    }
    else
    {
        if (valueInfo->GetSymStore() && instr->m_opcode == Js::OpCode::Ld_A && instr->GetDst()->IsRegOpnd()
            && valueInfo->GetSymStore() == instr->GetDst()->AsRegOpnd()->m_sym)
        {
            // Avoid resetting symStore after fieldHoisting:
            //  t1 = LdFld field            <- set symStore to fieldHoistSym
            //   fieldHoistSym = Ld_A t1    <- we're looking at t1 now, but want to copy-prop fieldHoistSym forward
            return opnd;
        }
        this->SetSymStoreDirect(valueInfo, opndSym);
    }
    return opnd;
}